

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

ON__UINT32 __thiscall
ON_XMLNodePrivate::DataCRC(ON_XMLNodePrivate *this,ON__UINT32 crc,bool recursive)

{
  ON_XMLNodePrivate *this_00;
  ON__UINT32 crc_00;
  ON_wString *this_01;
  ON_XMLProperty *pOVar1;
  ChildIterator cit;
  PropertyIterator pit;
  
  this_01 = TagName(this);
  crc_00 = ON_wString::DataCRCLower(this_01,crc);
  (*this->m_node->_vptr_ON_XMLNode[0x2d])(&pit,this->m_node,0);
  while( true ) {
    pOVar1 = ON_XMLNode::PropertyIterator::GetNextProperty(&pit);
    if (pOVar1 == (ON_XMLProperty *)0x0) break;
    crc_00 = (*pOVar1->_vptr_ON_XMLProperty[4])(pOVar1,(ulong)crc_00);
  }
  if (recursive) {
    (*this->m_node->_vptr_ON_XMLNode[0x2c])(&cit);
    while( true ) {
      if ((cit._private)->_current == (ON_XMLNode *)0x0) break;
      this_00 = (cit._private)->_current->_private;
      (cit._private)->_current = this_00->m_next_sibling;
      crc_00 = DataCRC(this_00,crc_00,true);
    }
    ON_XMLNode::ChildIterator::~ChildIterator(&cit);
  }
  ON_XMLNode::PropertyIterator::~PropertyIterator(&pit);
  return crc_00;
}

Assistant:

ON__UINT32 ON_XMLNodePrivate::DataCRC(ON__UINT32 crc, bool recursive) const
{
  crc = TagName().DataCRCLower(crc);

  auto pit = m_node.GetPropertyIterator();
  ON_XMLProperty* prop = nullptr;
  while (nullptr != (prop = pit.GetNextProperty()))
  {
    crc = prop->DataCRC(crc);
  }

  if (recursive)
  {
    auto cit = m_node.GetChildIterator();
    ON_XMLNode* child = nullptr;
    while (nullptr != (child = cit.GetNextChild()))
    {
      crc = child->_private->DataCRC(crc, recursive);
    }
  }

  return crc;
}